

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateUniformMatrixCaseBlocks
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool_bool
               *blockContentGenerator)

{
  deInt32 *pdVar1;
  undefined1 uVar2;
  MatrixOrder MVar3;
  Node *pNVar4;
  SharedPtrStateBase *pSVar5;
  Node *pNVar6;
  TestNode *node;
  long lVar7;
  byte bVar8;
  SharedPtr subStructure;
  SharedPtr uniform;
  SharedPtr defaultBlock;
  Layout layout;
  SharedPtr local_a0;
  bool local_89;
  Node *local_88;
  SharedPtrStateBase *pSStack_80;
  Node *local_78;
  SharedPtrStateBase *pSStack_70;
  Context *local_60;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool_bool *local_58;
  TestNode *local_50;
  _func_int **local_44 [2];
  MatrixOrder local_34;
  
  local_60 = context;
  local_58 = blockContentGenerator;
  local_50 = &targetGroup->super_TestNode;
  pNVar4 = (Node *)operator_new(0x20);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar4->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar4->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar5 = parentStructure->m_state;
  (pNVar4->m_enclosingNode).m_state = pSVar5;
  if (pSVar5 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1f90;
  pSStack_70 = (SharedPtrStateBase *)0x0;
  local_78 = pNVar4;
  pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar5->strongRefCount = 0;
  pSVar5->weakRefCount = 0;
  pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar5->strongRefCount = 1;
  pSVar5->weakRefCount = 1;
  pSStack_70 = pSVar5;
  pNVar6 = (Node *)operator_new(0x28);
  pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar6->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar6->m_enclosingNode).m_ptr = pNVar4;
  (pNVar6->m_enclosingNode).m_state = pSVar5;
  LOCK();
  pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar1 = &((pNVar6->m_enclosingNode).m_state)->weakRefCount;
  *pdVar1 = *pdVar1 + 1;
  UNLOCK();
  pNVar6->_vptr_Node = (_func_int **)&PTR__Node_021b1fc8;
  *(undefined4 *)&pNVar6[1]._vptr_Node = 3;
  pSStack_80 = (SharedPtrStateBase *)0x0;
  local_88 = pNVar6;
  pSStack_80 = (SharedPtrStateBase *)operator_new(0x20);
  pSStack_80->strongRefCount = 0;
  pSStack_80->weakRefCount = 0;
  pSStack_80->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSStack_80[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar6;
  pSStack_80->strongRefCount = 1;
  pSStack_80->weakRefCount = 1;
  lVar7 = 0x14;
  do {
    local_a0.m_ptr = local_88;
    local_a0.m_state = pSStack_80;
    if (pSStack_80 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_80->strongRefCount = pSStack_80->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pSStack_80->weakRefCount = pSStack_80->weakRefCount + 1;
      UNLOCK();
    }
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,local_60->m_testCtx,
               *(char **)((long)&PTR_typeinfo_name_021b21a8 + lVar7 + 4),
               *(char **)((long)&PTR_typeinfo_021b21b0 + lVar7 + 4));
    local_89 = (bool)(&UNK_021b21be)[lVar7];
    if (local_89 == true) {
      bVar8 = (&UNK_021b21bc)[lVar7] ^ 1;
    }
    else {
      bVar8 = false;
    }
    tcu::TestNode::addChild(local_50,node);
    MVar3 = *(MatrixOrder *)((long)&generateUniformMatrixCaseBlocks::children[0].name + lVar7);
    if (MVar3 != MATRIXORDER_LAST) {
      glu::Layout::Layout((Layout *)local_44,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      local_34 = MVar3;
      pNVar4 = (Node *)operator_new(0x38);
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar4->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar4->m_enclosingNode).m_ptr = local_a0.m_ptr;
      (pNVar4->m_enclosingNode).m_state = local_a0.m_state;
      if (local_a0.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_a0.m_state)->strongRefCount = (local_a0.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2190;
      pNVar4[1]._vptr_Node = local_44[0];
      *(_func_int ***)&pNVar4[1].m_type = local_44[1];
      *(MatrixOrder *)&pNVar4[1].m_enclosingNode.m_ptr = local_34;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      if (local_a0.m_state != pSVar5) {
        if (local_a0.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_a0.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_a0.m_ptr = (Node *)0x0;
            (*(local_a0.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_a0.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if ((*pdVar1 == 0) && (local_a0.m_state != (SharedPtrStateBase *)0x0)) {
            (*(local_a0.m_state)->_vptr_SharedPtrStateBase[1])();
          }
        }
        LOCK();
        pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pSVar5->weakRefCount = pSVar5->weakRefCount + 1;
        UNLOCK();
        local_a0.m_ptr = pNVar4;
        local_a0.m_state = pSVar5;
      }
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (*pSVar5->_vptr_SharedPtrStateBase[2])(pSVar5);
      }
      LOCK();
      pdVar1 = &pSVar5->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (*pSVar5->_vptr_SharedPtrStateBase[1])(pSVar5);
      }
    }
    if ((&UNK_021b21bc)[lVar7] == '\x01') {
      pNVar4 = (Node *)operator_new(0x28);
      uVar2 = (&UNK_021b21bd)[lVar7];
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar4->m_type = TYPE_INTERFACE_BLOCK;
      (pNVar4->m_enclosingNode).m_ptr = local_a0.m_ptr;
      (pNVar4->m_enclosingNode).m_state = local_a0.m_state;
      if (local_a0.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_a0.m_state)->strongRefCount = (local_a0.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar4->_vptr_Node = (_func_int **)&PTR__Node_021b2000;
      *(undefined1 *)&pNVar4[1]._vptr_Node = uVar2;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      if (local_a0.m_state != pSVar5) {
        if (local_a0.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_a0.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_a0.m_ptr = (Node *)0x0;
            (*(local_a0.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_a0.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if ((*pdVar1 == 0) && (local_a0.m_state != (SharedPtrStateBase *)0x0)) {
            (*(local_a0.m_state)->_vptr_SharedPtrStateBase[1])();
          }
        }
        LOCK();
        pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pSVar5->weakRefCount = pSVar5->weakRefCount + 1;
        UNLOCK();
        local_a0.m_ptr = pNVar4;
        local_a0.m_state = pSVar5;
      }
      LOCK();
      pdVar1 = &pSVar5->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (*pSVar5->_vptr_SharedPtrStateBase[2])(pSVar5);
      }
      LOCK();
      pdVar1 = &pSVar5->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (*pSVar5->_vptr_SharedPtrStateBase[1])(pSVar5);
      }
    }
    (*local_58)(local_60,&local_a0,(TestCaseGroup *)node,local_89,(bool)bVar8);
    if (local_a0.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_a0.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_a0.m_ptr = (Node *)0x0;
        (*(local_a0.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_a0.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_a0.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_a0.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_a0.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0xbc);
  if (pSStack_80 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_80->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_88 = (Node *)0x0;
      (*pSStack_80->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_80->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (pSStack_80 != (SharedPtrStateBase *)0x0) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_80 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_70 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSStack_70->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78 = (Node *)0x0;
      (*pSStack_70->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &pSStack_70->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (pSStack_70 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_70->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateUniformMatrixCaseBlocks (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup* const, bool, bool))
{
	static const struct
	{
		const char*			name;
		const char*			description;
		bool				block;
		bool				namedBlock;
		bool				extendedBasicTypeCases;
		glu::MatrixOrder	order;
	} children[] =
	{
		{ "default_block",				"Default block",			false,	true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block",				"Named uniform block",		true,	true,	true,	glu::MATRIXORDER_LAST			},
		{ "named_block_row_major",		"Named uniform block",		true,	true,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "named_block_col_major",		"Named uniform block",		true,	true,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
		{ "unnamed_block",				"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_LAST			},
		{ "unnamed_block_row_major",	"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_ROW_MAJOR		},
		{ "unnamed_block_col_major",	"Unnamed uniform block",	true,	false,	false,	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ResourceDefinition::Node::SharedPtr defaultBlock	(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr uniform		(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_UNIFORM));

	for (int childNdx = 0; childNdx < (int)DE_LENGTH_OF_ARRAY(children); ++childNdx)
	{
		ResourceDefinition::Node::SharedPtr	subStructure	= uniform;
		tcu::TestCaseGroup* const			blockGroup		= new tcu::TestCaseGroup(context.getTestContext(), children[childNdx].name, children[childNdx].description);
		const bool							addOpaqueCases	= children[childNdx].extendedBasicTypeCases && !children[childNdx].block;

		targetGroup->addChild(blockGroup);

		if (children[childNdx].order != glu::MATRIXORDER_LAST)
		{
			glu::Layout layout;
			layout.matrixOrder = children[childNdx].order;
			subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(subStructure, layout));
		}

		if (children[childNdx].block)
			subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::InterfaceBlock(subStructure, children[childNdx].namedBlock));

		blockContentGenerator(context, subStructure, blockGroup, children[childNdx].extendedBasicTypeCases, addOpaqueCases);
	}
}